

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O3

int readimage(fitsfile *fptr,int *status)

{
  int iVar1;
  ulong firstelem;
  float elapcpu;
  int hdutype;
  int anynull;
  double elapse;
  
  iVar1 = ffmahd(fptr,1,&hdutype,status);
  if (iVar1 == 0) {
    printf("\nRead back image                                 ");
    marktime(status);
    firstelem = 0xffffffffffffb1e1;
    do {
      firstelem = firstelem + 20000;
      ffgpvj(fptr,0,firstelem,20000,0,sarray,&anynull,status);
    } while (firstelem < 0x890621);
    gettime(&elapse,&elapcpu,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4042000000000000,elapse,
           (double)(float)(((double)elapcpu / elapse) * 100.0),(double)(float)(36.0 / elapse));
    return *status;
  }
  printerror(*status);
}

Assistant:

int readimage( fitsfile *fptr, int *status )

    /*********************/
    /* Read a FITS image */
    /*********************/
{
    int anynull, hdutype;
    long nremain, ii;
    long longnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the primary array */
    if ( fits_movabs_hdu(fptr, 1, &hdutype, status) ) 
         printerror( *status );

    printf("\nRead back image                                 ");
    marktime(status);

    nremain = XSIZE * YSIZE;
    for (ii=1; ii <= nremain; ii += SHTSIZE)
    {
      ffgpvj(fptr, 0, ii, SHTSIZE, longnull, sarray, &anynull, status);
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = XSIZE * 4. * YSIZE / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}